

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteBuiltin_collection_exists(jx9_context *pCtx,int argc,jx9_value **argv)

{
  unqlite_vm *pVm;
  int iVar1;
  char *pcVar2;
  unqlite_col *puVar3;
  uint iBool;
  int nByte;
  SyString sName;
  
  if (argc < 1) {
    pcVar2 = "Missing collection name";
  }
  else {
    pcVar2 = jx9_value_to_string(*argv,&nByte);
    if (0 < nByte) {
      sName.nByte = nByte;
      pVm = (unqlite_vm *)pCtx->pFunc->pUserData;
      sName.zString = pcVar2;
      puVar3 = unqliteVmFetchCollection(pVm,&sName);
      if (puVar3 == (unqlite_col *)0x0) {
        iVar1 = unqliteVmLoadCollection(pVm,pcVar2,nByte,2,(unqlite_col **)0x0);
        iBool = (uint)(iVar1 == 0);
      }
      else {
        iBool = 1;
      }
      goto LAB_00116263;
    }
    pcVar2 = "Invalid collection name";
  }
  jx9_context_throw_error(pCtx,1,pcVar2);
  iBool = 0;
LAB_00116263:
  jx9_result_bool(pCtx,iBool);
  return 0;
}

Assistant:

static int unqliteBuiltin_collection_exists(jx9_context *pCtx,int argc,jx9_value **argv)
{
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	int rc;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Perform the lookup */
	rc = unqliteExistsCollection(pVm, &sName);
	/* Lookup result */
	jx9_result_bool(pCtx, rc == UNQLITE_OK ? 1 : 0);
	return JX9_OK;
}